

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

void __thiscall anon_unknown.dwarf_4611f9::ImplPosix::Disconnect(ImplPosix *this,int status)

{
  long lVar1;
  
  if (this->Conn == None) {
    return;
  }
  (*(this->super_Impl)._vptr_Impl[4])();
  if (this->Conn == FIFO) {
    lVar1 = 0x90;
  }
  else {
    if (this->Conn != FDs) goto LAB_002127c0;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->ConnRead);
    lVar1 = 0x80;
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
            ((uv_handle_ptr_base_<uv_pipe_s> *)((long)&(this->super_Impl)._vptr_Impl + lVar1));
LAB_002127c0:
  this->Conn = None;
  if (status == 0) {
    return;
  }
  cmUVJobServerClient::Impl::Disconnected(&this->super_Impl,status);
  return;
}

Assistant:

void ImplPosix::Disconnect(int status)
{
  if (this->Conn == Connection::None) {
    return;
  }

  this->StopReceivingTokens();

  switch (this->Conn) {
    case Connection::FDs:
      this->ConnRead.reset();
      this->ConnWrite.reset();
      break;
    case Connection::FIFO:
      this->ConnFIFO.reset();
      break;
    default:
      break;
  }

  this->Conn = Connection::None;
  if (status != 0) {
    this->Disconnected(status);
  }
}